

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

void density_tests::detail::
     PutString<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
     ::consume(consume_operation *i_consume)

{
  int iVar1;
  runtime_type<> *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  prVar2 = density::
           sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::consume_operation::complete_type((consume_operation *)i_consume);
  if (prVar2->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
      ::s_table) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x5d);
  }
  pbVar3 = density::
           sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
           ::consume_operation::element<std::__cxx11::string>((consume_operation *)i_consume);
  iVar1 = std::__cxx11::string::compare((char *)pbVar3);
  if (iVar1 != 0) {
    assert_failed<>("i_consume.template element<ElementType>() == \"hello world!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x5e);
    return;
  }
  return;
}

Assistant:

static void consume(const typename QUEUE::consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                DENSITY_TEST_ASSERT(i_consume.template element<ElementType>() == "hello world!");
            }